

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O1

Datatype * __thiscall TypeOpCall::getInputLocal(TypeOpCall *this,PcodeOp *op,int4 slot)

{
  Varnode *pVVar1;
  uintb uVar2;
  bool bVar3;
  int iVar4;
  Datatype *pDVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer ppVVar6;
  Datatype *pDVar7;
  
  ppVVar6 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (slot != 0) {
    pVVar1 = *ppVVar6;
    if (((pVVar1->loc).base)->type == IPTR_FSPEC) {
      uVar2 = (pVVar1->loc).offset;
      iVar4 = (**(code **)(**(long **)(uVar2 + 8) + 0x28))();
      if ((iVar4 == (int)((ulong)((long)(op->inrefs).
                                        super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)(op->inrefs).
                                       super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 3) + -1) ||
         ((*(byte *)(uVar2 + 0x14) & 1) != 0)) {
        pDVar5 = (Datatype *)
                 (**(code **)(**(long **)(uVar2 + 8) + 0x30))(*(long **)(uVar2 + 8),slot + -1);
        pDVar7 = pDVar5;
        if (pDVar5 == (Datatype *)0x0) {
LAB_0023ed0a:
          bVar3 = true;
        }
        else {
          iVar4 = (*pDVar5->_vptr_Datatype[6])(pDVar5);
          pDVar7 = (Datatype *)CONCAT44(extraout_var,iVar4);
          if ((char)iVar4 == '\0') goto LAB_0023ed0a;
          iVar4 = (*pDVar5->_vptr_Datatype[3])(pDVar5);
          pDVar7 = (Datatype *)CONCAT44(extraout_var_00,iVar4);
          if ((pDVar7->metatype == TYPE_VOID) ||
             ((op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start[slot]->size < pDVar7->size)) goto LAB_0023ed0a;
          bVar3 = false;
        }
        if (!bVar3) {
          return pDVar7;
        }
      }
      ppVVar6 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start + slot;
      goto LAB_0023ed24;
    }
  }
  ppVVar6 = ppVVar6 + slot;
LAB_0023ed24:
  pDVar7 = TypeFactory::getBase((this->super_TypeOp).tlst,(*ppVVar6)->size,TYPE_UNKNOWN);
  return pDVar7;
}

Assistant:

Datatype *TypeOpCall::getInputLocal(const PcodeOp *op,int4 slot) const

{
  const FuncCallSpecs *fc;
  const Varnode *vn;
  Datatype *ct;

  vn = op->getIn(0);
  if ((slot==0)||(vn->getSpace()->getType()!=IPTR_FSPEC))// Do we have a prototype to look at
    return TypeOp::getInputLocal(op,slot);
    
  // Get types of call input parameters
  fc = FuncCallSpecs::getFspecFromConst(vn->getAddr());
  // Its false to assume that the parameter symbol corresponds
  // to the varnode in the same slot, but this is easiest until
  // we get giant sized parameters working properly
  if ((fc->numParams() == op->numInput()-1)||(fc->isDotdotdot())) {
    ProtoParameter *param = fc->getParam(slot-1);
    if ((param != (ProtoParameter *)0)&&(param->isTypeLocked())) {
      ct = param->getType();
      if ((ct->getMetatype() != TYPE_VOID)&&
	  (ct->getSize() <= op->getIn(slot)->getSize())) // parameter may not match varnode
	return ct;
    }
  }
  return TypeOp::getInputLocal(op,slot);
}